

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint *input;
  long lVar1;
  uchar *output;
  uint *puVar2;
  uint *output_00;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  etdc_table *table;
  etdc_table *local_38;
  
  local_38 = (etdc_table *)0x0;
  input = (uint *)malloc(40000000);
  uVar4 = 0;
  uVar5 = 1;
  uVar6 = 2;
  uVar7 = 3;
  lVar1 = 0;
  do {
    puVar2 = input + lVar1;
    *puVar2 = uVar4;
    puVar2[1] = uVar5;
    puVar2[2] = uVar6;
    puVar2[3] = uVar7;
    lVar1 = lVar1 + 4;
    uVar4 = uVar4 + 4;
    uVar5 = uVar5 + 4;
    uVar6 = uVar6 + 4;
    uVar7 = uVar7 + 4;
  } while (lVar1 != 10000000);
  output = (uchar *)malloc(40000000);
  uVar4 = firstpass(&local_38,input,10000000);
  printf("Table: ");
  etdc_print(local_38);
  uVar5 = etdc_encode(&local_38,input,10000000,output);
  puVar2 = (uint *)malloc((ulong)uVar4 * 4);
  etdc_voc2uint(local_38,puVar2);
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      printf("voc[%u] = %u\n",uVar3 & 0xffffffff,(ulong)puVar2[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  etdc_free(&local_38);
  output_00 = (uint *)malloc(40000000);
  etdc_decode(puVar2,uVar4,output,uVar5,output_00,10000000);
  lVar1 = 0;
  do {
    if (input[lVar1] != output_00[lVar1]) {
      printf("waaa %u %u\n");
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10000000);
  free(output);
  puts("END");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  struct etdc_table *table = NULL;
  unsigned char *output;
  unsigned int voc_size;
  int newsize;
  unsigned int *voctable;

  unsigned int *items;
  unsigned int size;
  unsigned int i;

  unsigned int *decoded;

  size = 10000000;
  items = (unsigned int *)malloc(sizeof(unsigned int)*size);
  for(i=0; i < size; i++) items[i]=i;

  
  output = (unsigned char*)malloc(sizeof(unsigned int)*size);
  voc_size = firstpass(&table, items, size);
  printf("Table: "); etdc_print(table);


  newsize = etdc_encode(&table, items, size, output);

  voctable = (unsigned int*) malloc(sizeof(unsigned int)*voc_size);
  etdc_voc2uint(table,voctable);
  for (i=0; i<voc_size;i++) printf("voc[%u] = %u\n", i, voctable[i]);
  
  etdc_free(&table);

  decoded = (unsigned int*)malloc(sizeof(unsigned int)*size);
  etdc_decode(voctable, voc_size, output, newsize, decoded, size);

  for(i=0; i<size; i++) {
    if(items[i] != decoded[i]) {
      printf("waaa %u %u\n", items[i], decoded[i]);
    }

  }

  free(output);

  printf("END\n");
  return 0;
}